

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR get_argument(lysp_yang_ctx *ctx,yang_arg arg,uint16_t *flags,char **word_p,char **word_b,
                   size_t *word_len)

{
  uint64_t *puVar1;
  byte bVar2;
  ly_in *plVar3;
  byte *pbVar4;
  LY_ERR LVar5;
  char *pcVar6;
  LY_VECODE code;
  int iVar7;
  uint8_t comment;
  ly_ctx *plVar8;
  long local_58;
  size_t buf_len;
  uint8_t prefix;
  long local_38;
  
  buf_len = 0;
  prefix = '\0';
  *word_b = (char *)0x0;
  *word_p = (char *)0x0;
  *word_len = 0;
LAB_001701ca:
  do {
    while( true ) {
      plVar3 = ctx->in;
      pbVar4 = (byte *)plVar3->current;
      bVar2 = *pbVar4;
      if (0x1f < bVar2) break;
      if (bVar2 < 10) {
        if (bVar2 != 9) {
          if (bVar2 != 0) goto LAB_001702fa;
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar6 = "Unexpected end-of-input.";
          code = LYVE_SYNTAX;
LAB_001703d8:
          ly_vlog(plVar8,(char *)0x0,code,pcVar6);
LAB_00170a90:
          LVar5 = LY_EVALID;
          goto LAB_00170a95;
        }
        if (*word_len != 0) goto LAB_00170a09;
        ctx->indent = ctx->indent + 8;
        plVar3->current = (char *)(pbVar4 + 1);
      }
      else {
        if (bVar2 != 10) {
          if (bVar2 != 0xd) goto LAB_001702fa;
          if (pbVar4[1] != 10) {
            ly_vlog((ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
                    ,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",0xd);
            goto LAB_00170a90;
          }
          ly_in_skip(plVar3,1);
          ctx->indent = ctx->indent + 1;
        }
        if (*word_len != 0) {
LAB_00170a09:
          if (*word_b == (char *)0x0) {
            return LY_SUCCESS;
          }
          pcVar6 = (char *)ly_realloc(*word_b,*word_len + 1);
          *word_b = pcVar6;
          if (pcVar6 != (char *)0x0) {
            pcVar6[*word_len] = '\0';
            *word_p = *word_b;
            return LY_SUCCESS;
          }
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","get_argument");
          return LY_EMEM;
        }
        plVar3 = ctx->in;
        puVar1 = &plVar3->line;
        *puVar1 = *puVar1 + 1;
        ly_in_skip(plVar3,1);
        ctx->indent = 0;
      }
    }
    if (bVar2 < 0x2f) {
      if (bVar2 == 0x20) {
        if (*word_len != 0) goto LAB_00170a09;
        ly_in_skip(plVar3,1);
        ctx->indent = ctx->indent + 1;
        goto LAB_001701ca;
      }
      if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
        if (*word_len == 0) {
          if (flags != (uint16_t *)0x0) {
            *flags = *flags | (ushort)(bVar2 != 0x27) * 0x100 + 0x100;
          }
          if (*pbVar4 == 0x27) {
            local_58 = 0;
            iVar7 = 1;
          }
          else {
            if (*pbVar4 != 0x22) {
              __assert_fail("ctx->in->current[0] == \'\\\'\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                            ,0x158,
                            "LY_ERR read_qstring(struct lysp_yang_ctx *, enum yang_arg, char **, char **, size_t *, size_t *)"
                           );
            }
            local_58 = ctx->indent + 1;
            iVar7 = 2;
          }
          ly_in_skip(plVar3,1);
          ctx->indent = ctx->indent + 1;
          if (*ctx->in->current != '\0') {
            local_38 = 8 - local_58;
            LVar5 = (*(code *)(&DAT_001d5258 + *(int *)(&DAT_001d5258 + (ulong)(iVar7 - 1) * 4)))
                              (ctx->in,&DAT_001d5258,
                               &DAT_001d5258 + *(int *)(&DAT_001d5258 + (ulong)(iVar7 - 1) * 4));
            return LVar5;
          }
          if ((Y_PREF_IDENTIF_ARG < arg) || (*word_len != 0)) {
            if (*word_p == (char *)0x0) {
              *word_p = "";
            }
            goto LAB_00170a09;
          }
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar6 = "Statement argument is required.";
          code = LYVE_SYNTAX_YANG;
          goto LAB_001703d8;
        }
LAB_0017036b:
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar6 = "unquoted string character, optsep, semicolon or opening brace";
LAB_0017038d:
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",1
                ,pbVar4,pcVar6);
        goto LAB_00170a90;
      }
LAB_001702fa:
      LVar5 = buf_store_char(ctx,arg,word_p,word_len,word_b,&buf_len,'\0',&prefix);
    }
    else {
      if (0x3a < bVar2) {
        if ((bVar2 == 0x3b) || (bVar2 == 0x7b)) {
          if ((arg == Y_MAYBE_STR_ARG) || (*word_len != 0)) goto LAB_00170a09;
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar6 = "an argument";
          goto LAB_0017038d;
        }
        if (bVar2 == 0x7d) goto LAB_0017036b;
        goto LAB_001702fa;
      }
      if (bVar2 != 0x2f) goto LAB_001702fa;
      if (pbVar4[1] == 0x2f) {
        comment = '\x01';
      }
      else {
        if (pbVar4[1] != 0x2a) goto LAB_001702fa;
        comment = '\x02';
      }
      if (*word_len != 0) {
        ly_vlog((ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                (char *)0x0,LYVE_SYNTAX,"Invalid comment sequence \"%.2s\" in an unquoted string.",
                pbVar4);
        goto LAB_00170a90;
      }
      ly_in_skip(plVar3,2);
      ctx->indent = ctx->indent + 2;
      LVar5 = skip_comment(ctx,comment);
    }
    if (LVar5 != LY_SUCCESS) {
LAB_00170a95:
      free(*word_b);
      *word_b = (char *)0x0;
      return LVar5;
    }
  } while( true );
}

Assistant:

LY_ERR
get_argument(struct lysp_yang_ctx *ctx, enum yang_arg arg, uint16_t *flags, char **word_p,
        char **word_b, size_t *word_len)
{
    LY_ERR ret;
    size_t buf_len = 0;
    uint8_t prefix = 0;
    ly_bool str_end = 0;
    int comment;

    /* word buffer - dynamically allocated */
    *word_b = NULL;

    /* word pointer - just a pointer to data */
    *word_p = NULL;

    *word_len = 0;
    while (!str_end) {
        switch (ctx->in->current[0]) {
        case '\'':
        case '\"':
            if (*word_len) {
                /* invalid - quotes cannot be in unquoted string and only optsep, ; or { can follow it */
                LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                        "unquoted string character, optsep, semicolon or opening brace");
                ret = LY_EVALID;
                goto error;
            }
            if (flags) {
                (*flags) |= (ctx->in->current[0] == '\'') ? LYS_SINGLEQUOTED : LYS_DOUBLEQUOTED;
            }

            LY_CHECK_GOTO(ret = read_qstring(ctx, arg, word_p, word_b, word_len, &buf_len), error);
            if (!*word_p) {
                /* do not return NULL word */
                *word_p = "";
            }
            str_end = 1;
            break;
        case '/':
            comment = 0;
            if (ctx->in->current[1] == '/') {
                /* one-line comment */
                comment = 1;
            } else if (ctx->in->current[1] == '*') {
                /* block comment */
                comment = 2;
            } else {
                /* not a comment after all */
                LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            }

            if (comment) {
                if (*word_len) {
                    /* invalid comment sequence (RFC 7950 sec. 6.1.3.) */
                    LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Invalid comment sequence \"%.2s\" in an unquoted string.", ctx->in->current);
                    ret = LY_EVALID;
                    goto error;
                }

                /* skip the comment */
                MOVE_INPUT(ctx, 2);
                LY_CHECK_GOTO(ret = skip_comment(ctx, comment), error);
            }
            break;
        case ' ':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            MOVE_INPUT(ctx, 1);
            break;
        case '\t':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            /* tabs count for 8 spaces */
            ctx->indent += Y_TAB_SPACES;

            ++ctx->in->current;
            break;
        case '\r':
            if (ctx->in->current[1] != '\n') {
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[0]);
                ret = LY_EVALID;
                goto error;
            }
            MOVE_INPUT(ctx, 1);
        /* fallthrough */
        case '\n':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            LY_IN_NEW_LINE(ctx->in);
            MOVE_INPUT(ctx, 1);

            /* reset indent */
            ctx->indent = 0;
            break;
        case ';':
        case '{':
            if (*word_len || (arg == Y_MAYBE_STR_ARG)) {
                /* word is finished */
                str_end = 1;
                break;
            }

            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current, "an argument");
            ret = LY_EVALID;
            goto error;
        case '}':
            /* invalid - braces cannot be in unquoted string (opening braces terminates the string and can follow it) */
            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                    "unquoted string character, optsep, semicolon or opening brace");
            ret = LY_EVALID;
            goto error;
        case '\0':
            /* unexpected EOF */
            LOGVAL_PARSER(ctx, LY_VCODE_EOF);
            ret = LY_EVALID;
            goto error;
        default:
            LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            break;
        }
    }

    /* terminating NULL byte for buf */
    if (*word_b) {
        (*word_b) = ly_realloc(*word_b, (*word_len) + 1);
        LY_CHECK_ERR_RET(!(*word_b), LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
        (*word_b)[*word_len] = '\0';
        *word_p = *word_b;
    }

    return LY_SUCCESS;

error:
    free(*word_b);
    *word_b = NULL;
    return ret;
}